

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall
QIconModeViewBase::doDynamicLayout(QIconModeViewBase *this,QListViewLayoutInfo *info)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  undefined1 uVar4;
  Promoted<int,_short> PVar5;
  int iVar6;
  int iVar7;
  QRect *this_00;
  QRect *pQVar8;
  reference this_01;
  int *piVar9;
  ulong uVar10;
  QListViewItem *in_RSI;
  QCommonListViewBase *in_RDI;
  long in_FS_OFFSET;
  int row_1;
  int insertFrom;
  bool done;
  int row;
  QListViewItem *item;
  int segPosition;
  int flowPosition;
  int deltaFlowPosition;
  int segEndPosition;
  int segStartPosition;
  bool useItemSize;
  QRect changedRect;
  QRect rect;
  int deltaSegHint;
  int deltaSegPosition;
  QPoint topLeft;
  QCommonListViewBase *in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  QListViewItem *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  uint uVar11;
  QCommonListViewBase *in_stack_fffffffffffffed8;
  int local_118;
  int local_114;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  uint uVar12;
  undefined4 in_stack_ffffffffffffff04;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  QRect local_c8;
  QPoint local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  QRect local_a0;
  QSize local_90;
  QSize local_88;
  QSize local_80;
  QRect local_78 [3];
  QRect local_48;
  int local_38;
  int local_34 [3];
  undefined1 *local_28;
  undefined1 *local_20;
  int local_18;
  Representation local_14;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QSize::isValid((QSize *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  bVar3 = (bVar2 ^ 0xffU) & 1;
  local_10 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = initDynamicLayout((QIconModeViewBase *)
                               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                               (QListViewLayoutInfo *)
                               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  local_14.m_i = -0x55555556;
  local_18 = -0x55555556;
  if (in_RSI[2].x == 0) {
    local_e0 = QRect::left((QRect *)0x886b63);
    local_e0 = local_e0 + in_RSI[1].y;
    local_e4 = QRect::right((QRect *)0x886b79);
    local_e8 = QSize::width((QSize *)0x886b8b);
    if (bVar3 == 0) {
      local_114 = QSize::height((QSize *)0x886bb2);
    }
    else {
      local_114 = in_RDI->batchSavedDeltaSeg;
    }
    local_14.m_i = local_114;
    local_18 = QSize::height((QSize *)0x886bcf);
    local_ec = QPoint::x((QPoint *)0x886be3);
    local_f0 = QPoint::y((QPoint *)0x886bf4);
  }
  else {
    local_e0 = QRect::top((QRect *)0x886c07);
    local_e0 = local_e0 + in_RSI[1].y;
    local_e4 = QRect::bottom((QRect *)0x886c1d);
    local_e8 = QSize::height((QSize *)0x886c2f);
    if (bVar3 == 0) {
      local_118 = QSize::width((QSize *)0x886c56);
    }
    else {
      local_118 = in_RDI->batchSavedDeltaSeg;
    }
    local_14.m_i = local_118;
    local_18 = QSize::width((QSize *)0x886c73);
    local_ec = QPoint::y((QPoint *)0x886c87);
    local_f0 = QPoint::x((QPoint *)0x886c98);
  }
  this_00 = (QRect *)QBitArray::size((QBitArray *)
                                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  pQVar8 = (QRect *)QList<QListViewItem>::size((QList<QListViewItem> *)&in_RDI[2].qq);
  if (this_00 != pQVar8) {
    in_stack_fffffffffffffed8 = in_RDI + 3;
    QList<QListViewItem>::size((QList<QListViewItem> *)&in_RDI[2].qq);
    QBitArray::resize((longlong)in_stack_fffffffffffffed8);
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  QRect::QRect(this_00,(QPoint *)in_stack_fffffffffffffed8,
               (QPoint *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  iVar6._0_2_ = in_RSI[1].w;
  iVar6._2_2_ = in_RSI[1].h;
  for (; iVar6 <= in_RSI[1].indexHint; iVar6 = iVar6 + 1) {
    this_01 = QList<QListViewItem>::operator[]
                        ((QList<QListViewItem> *)
                         CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                         (qsizetype)in_stack_fffffffffffffeb8);
    bVar2 = QCommonListViewBase::isHidden
                      ((QCommonListViewBase *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    if (bVar2) {
      QListViewItem::invalidate(this_01);
    }
    else {
      if (bVar3 == 0) {
        local_34[0] = QSize::width((QSize *)0x886de9);
        PVar5 = qMin<int,short>(local_34,&this_01->w);
        this_01->w = (short)PVar5;
        local_38 = QSize::height((QSize *)0x886e20);
        PVar5 = qMin<int,short>(&local_38,&this_01->h);
        this_01->h = (short)PVar5;
      }
      else if (in_RSI[2].x == 0) {
        local_e8 = (int)this_01->w + in_RSI[1].y;
      }
      else {
        local_e8 = (int)this_01->h + in_RSI[1].y;
      }
      if ((((in_RSI[1].visited & 1) != 0) && (local_e4 < local_ec + local_e8)) &&
         (local_e0 < local_ec)) {
        local_ec = local_e0;
        local_f0 = local_14.m_i + local_f0;
        if (bVar3 != 0) {
          local_14.m_i = 0;
        }
      }
      if (bVar3 != 0) {
        if (in_RSI[2].x == 0) {
          local_18 = (int)this_01->h + in_RSI[1].y;
        }
        else {
          local_18 = (int)this_01->w + in_RSI[1].y;
        }
        piVar9 = qMax<int>(&local_14.m_i,&local_18);
        local_14.m_i = *piVar9;
      }
      bVar2 = QBitArray::testBit((QBitArray *)
                                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                 (qsizetype)in_stack_fffffffffffffeb8);
      if (!bVar2) {
        if (in_RSI[2].x == 0) {
          if (bVar3 == 0) {
            this_01->x = local_ec + (local_e8 - this_01->w) / 2;
            this_01->y = local_f0;
          }
          else {
            this_01->x = local_ec;
            this_01->y = local_f0;
          }
        }
        else if (bVar3 == 0) {
          this_01->y = local_ec + (local_e8 - this_01->h) / 2;
          this_01->x = local_f0;
        }
        else {
          this_01->y = local_ec;
          this_01->x = local_f0;
        }
      }
      if (bVar3 == 0) {
        iVar7 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
        if (in_RSI[2].x == 0) {
          QRect::QRect((QRect *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                       in_stack_fffffffffffffec0,iVar7,(int)in_stack_fffffffffffffeb8);
          QRect::operator|=((QRect *)in_stack_fffffffffffffec8,
                            (QRect *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        }
        else {
          QRect::QRect((QRect *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                       in_stack_fffffffffffffec0,iVar7,(int)in_stack_fffffffffffffeb8);
          QRect::operator|=((QRect *)in_stack_fffffffffffffec8,
                            (QRect *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        }
      }
      else {
        local_48 = QListViewItem::rect(in_stack_fffffffffffffec8);
        QRect::operator|=((QRect *)in_stack_fffffffffffffec8,
                          (QRect *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      }
      local_ec = local_e8 + local_ec;
    }
  }
  in_RDI->batchSavedDeltaSeg = local_14.m_i;
  in_RDI->batchStartRow = in_RSI[1].indexHint + 1;
  iVar6 = in_RSI[1].indexHint;
  iVar7 = QCommonListViewBase::rowCount
                    ((QCommonListViewBase *)CONCAT44(in_stack_fffffffffffffed4,iVar6));
  bVar2 = iVar7 + -1 <= iVar6;
  uVar12 = (uint)bVar2 << 0x18;
  uVar11 = CONCAT13(1,(int3)in_stack_fffffffffffffed4);
  if (!bVar2) {
    in_stack_fffffffffffffec8 = in_RSI;
    local_78[0] = QListViewItem::rect(in_RSI);
    uVar4 = QRect::contains((QRect *)in_stack_fffffffffffffec8,SUB81(local_78,0));
    uVar11 = CONCAT13(uVar4,(int3)uVar11) ^ 0xff000000;
  }
  if ((uVar11 & 0x1000000) != 0) {
    local_80 = QRect::size((QRect *)CONCAT44(uVar11,iVar6));
    in_RDI->contentsSize = local_80;
    if (in_RSI[2].x == 0) {
      in_stack_fffffffffffffec4 = in_RSI[1].y;
      piVar9 = QSize::rheight((QSize *)0x88717b);
      *piVar9 = in_stack_fffffffffffffec4 + *piVar9;
    }
    else {
      in_stack_fffffffffffffec0 = in_RSI[1].y;
      piVar9 = QSize::rwidth((QSize *)0x88719f);
      *piVar9 = in_stack_fffffffffffffec0 + *piVar9;
    }
  }
  local_88 = QRect::size((QRect *)CONCAT44(uVar11,iVar6));
  bVar2 = QSize::isEmpty((QSize *)CONCAT44(uVar11,iVar6));
  if (!bVar2) {
    iVar7._0_2_ = in_RSI[1].w;
    iVar7._2_2_ = in_RSI[1].h;
    if (((uVar12 & 0x1000000) != 0) ||
       (iVar1._0_2_ = in_RSI[1].w, iVar1._2_2_ = in_RSI[1].h, iVar1 == 0)) {
      local_90 = QRect::size((QRect *)CONCAT44(uVar11,iVar6));
      initBspTree((QIconModeViewBase *)CONCAT44(iVar7,in_stack_fffffffffffffef8),(QSize *)in_RDI);
      iVar7 = 0;
    }
    for (; iVar7 <= in_RSI[1].indexHint; iVar7 = iVar7 + 1) {
      in_stack_fffffffffffffeb8 = in_RDI + 1;
      QList<QListViewItem>::at
                ((QList<QListViewItem> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (qsizetype)in_stack_fffffffffffffeb8);
      local_a0 = QListViewItem::rect(in_stack_fffffffffffffec8);
      QBspTree::insertLeaf
                ((QBspTree *)CONCAT44(uVar11,iVar6),(QRect *)in_stack_fffffffffffffec8,
                 in_stack_fffffffffffffec4);
    }
    local_b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = QRect::bottomRight((QRect *)in_stack_fffffffffffffeb8);
    QRect::QRect(this_00,(QPoint *)in_stack_fffffffffffffed8,(QPoint *)CONCAT44(uVar11,iVar6));
    local_c8 = QCommonListViewBase::clipRect((QCommonListViewBase *)0x8872eb);
    uVar10 = QRect::intersects((QRect *)&local_c8);
    if ((uVar10 & 1) != 0) {
      QCommonListViewBase::viewport(in_RDI);
      QWidget::update((QWidget *)in_stack_fffffffffffffeb8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QIconModeViewBase::doDynamicLayout(const QListViewLayoutInfo &info)
{
    const bool useItemSize = !info.grid.isValid();
    const QPoint topLeft = initDynamicLayout(info);

    int segStartPosition;
    int segEndPosition;
    int deltaFlowPosition;
    int deltaSegPosition;
    int deltaSegHint;
    int flowPosition;
    int segPosition;

    if (info.flow == QListView::LeftToRight) {
        segStartPosition = info.bounds.left() + info.spacing;
        segEndPosition = info.bounds.right();
        deltaFlowPosition = info.grid.width(); // dx
        deltaSegPosition = (useItemSize ? batchSavedDeltaSeg : info.grid.height()); // dy
        deltaSegHint = info.grid.height();
        flowPosition = topLeft.x();
        segPosition = topLeft.y();
    } else { // flow == QListView::TopToBottom
        segStartPosition = info.bounds.top() + info.spacing;
        segEndPosition = info.bounds.bottom();
        deltaFlowPosition = info.grid.height(); // dy
        deltaSegPosition = (useItemSize ? batchSavedDeltaSeg : info.grid.width()); // dx
        deltaSegHint = info.grid.width();
        flowPosition = topLeft.y();
        segPosition = topLeft.x();
    }

    if (moved.size() != items.size())
        moved.resize(items.size());

    QRect rect(QPoint(), topLeft);
    QListViewItem *item = nullptr;
    Q_ASSERT(info.first <= info.last);
    for (int row = info.first; row <= info.last; ++row) {
        item = &items[row];
        if (isHidden(row)) {
            item->invalidate();
        } else {
            // if we are not using a grid, we need to find the deltas
            if (useItemSize) {
                if (info.flow == QListView::LeftToRight)
                    deltaFlowPosition = item->w + info.spacing;
                else
                    deltaFlowPosition = item->h + info.spacing;
            } else {
                item->w = qMin<int>(info.grid.width(), item->w);
                item->h = qMin<int>(info.grid.height(), item->h);
            }

            // create new segment
            if (info.wrap
                && flowPosition + deltaFlowPosition > segEndPosition
                && flowPosition > segStartPosition) {
                flowPosition = segStartPosition;
                segPosition += deltaSegPosition;
                if (useItemSize)
                    deltaSegPosition = 0;
            }
            // We must delay calculation of the seg adjustment, as this item
            // may have caused a wrap to occur
            if (useItemSize) {
                if (info.flow == QListView::LeftToRight)
                    deltaSegHint = item->h + info.spacing;
                else
                    deltaSegHint = item->w + info.spacing;
                deltaSegPosition = qMax(deltaSegPosition, deltaSegHint);
            }

            // set the position of the item
            // ### idealy we should have some sort of alignment hint for the item
            // ### (normally that would be a point between the icon and the text)
            if (!moved.testBit(row)) {
                if (info.flow == QListView::LeftToRight) {
                    if (useItemSize) {
                        item->x = flowPosition;
                        item->y = segPosition;
                    } else { // use grid
                        item->x = flowPosition + ((deltaFlowPosition - item->w) / 2);
                        item->y = segPosition;
                    }
                } else { // TopToBottom
                    if (useItemSize) {
                        item->y = flowPosition;
                        item->x = segPosition;
                    } else { // use grid
                        item->y = flowPosition + ((deltaFlowPosition - item->h) / 2);
                        item->x = segPosition;
                    }
                }
            }

            // let the contents contain the new item
            if (useItemSize)
                rect |= item->rect();
            else if (info.flow == QListView::LeftToRight)
                rect |= QRect(flowPosition, segPosition, deltaFlowPosition, deltaSegPosition);
            else // flow == TopToBottom
                rect |= QRect(segPosition, flowPosition, deltaSegPosition, deltaFlowPosition);

            // prepare for next item
            flowPosition += deltaFlowPosition; // current position + item width + gap
        }
    }
    Q_ASSERT(item);
    batchSavedDeltaSeg = deltaSegPosition;
    batchStartRow = info.last + 1;
    bool done = (info.last >= rowCount() - 1);
    // resize the content area
    if (done || !info.bounds.contains(item->rect())) {
        contentsSize = rect.size();
        if (info.flow == QListView::LeftToRight)
            contentsSize.rheight() += info.spacing;
        else
            contentsSize.rwidth() += info.spacing;
    }
    if (rect.size().isEmpty())
        return;
    // resize tree
    int insertFrom = info.first;
    if (done || info.first == 0) {
        initBspTree(rect.size());
        insertFrom = 0;
    }
    // insert items in tree
    for (int row = insertFrom; row <= info.last; ++row)
        tree.insertLeaf(items.at(row).rect(), row);
    // if the new items are visible, update the viewport
    QRect changedRect(topLeft, rect.bottomRight());
    if (clipRect().intersects(changedRect))
        viewport()->update();
}